

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::IntrusiveListIteratorTest::
TestBackward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
          (IntrusiveListIteratorTest *this,
          reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
          *first,reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
                 *last,vector<int,_std::allocator<int>_> *expected)

{
  bool bVar1;
  const_reference lhs;
  pointer pTVar2;
  char *pcVar3;
  AssertHelper local_80;
  Message local_78;
  size_type local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_50;
  Message local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  size_t count;
  vector<int,_std::allocator<int>_> *expected_local;
  reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
  *last_local;
  reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
  *first_local;
  IntrusiveListIteratorTest *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    bVar1 = std::operator!=(first,last);
    if (!bVar1) {
      local_70 = std::vector<int,_std::allocator<int>_>::size(expected);
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                ((EqHelper<false> *)local_68,"count","expected.size()",
                 (unsigned_long *)&gtest_ar.message_,&local_70);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
      if (!bVar1) {
        testing::Message::Message(&local_78);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-intrusive-list.cc"
                   ,0xb1,pcVar3);
        testing::internal::AssertHelper::operator=(&local_80,&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        testing::Message::~Message(&local_78);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
      return;
    }
    std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>::
    operator--(last);
    lhs = std::vector<int,_std::allocator<int>_>::operator[]
                    (expected,(size_type)gtest_ar.message_.ptr_);
    pTVar2 = std::
             reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
             ::operator->(last);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_40,"expected[count]","last->data",lhs,&pTVar2->data);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
    if (!bVar1) {
      testing::Message::Message(&local_48);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-intrusive-list.cc"
                 ,0xae,pcVar3);
      testing::internal::AssertHelper::operator=(&local_50,&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      testing::Message::~Message(&local_48);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
    if (gtest_ar_1.message_.ptr_._4_4_ != 0) break;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(gtest_ar.message_.ptr_)->field_0x1;
  }
  return;
}

Assistant:

void TestBackward(Iter first, Iter last, const std::vector<int>& expected) {
    size_t count = 0;
    while (first != last) {
      --last;
      ASSERT_EQ(expected[count], last->data);
      ++count;
    }
    ASSERT_EQ(count, expected.size());
  }